

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * getgeneric(Table *t,TValue *key,int deadok)

{
  int iVar1;
  Node *pNStack_30;
  int nx;
  Node *n;
  int deadok_local;
  TValue *key_local;
  Table *t_local;
  
  pNStack_30 = mainpositionTV(t,key);
  while( true ) {
    iVar1 = equalkey(key,pNStack_30,deadok);
    if (iVar1 != 0) {
      return (TValue *)pNStack_30;
    }
    if ((pNStack_30->u).next == 0) break;
    pNStack_30 = pNStack_30 + (pNStack_30->u).next;
  }
  return &absentkey;
}

Assistant:

static const TValue *getgeneric (Table *t, const TValue *key, int deadok) {
  Node *n = mainpositionTV(t, key);
  for (;;) {  /* check whether 'key' is somewhere in the chain */
    if (equalkey(key, n, deadok))
      return gval(n);  /* that's it */
    else {
      int nx = gnext(n);
      if (nx == 0)
        return &absentkey;  /* not found */
      n += nx;
    }
  }
}